

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterDropShadow.cpp
# Opt level: O0

void __thiscall
Rml::FilterDropShadow::ExtendInkOverflow
          (FilterDropShadow *this,Element *element,Rectanglef *scissor_region)

{
  float fVar1;
  float x;
  float y;
  Rectangle<float> RVar2;
  Vector2<float> local_b0;
  Vector2f local_a8;
  Vector2f local_a0;
  Vector2f local_94;
  Vector2<float> local_8c;
  Vector2<float> local_84;
  Vector2f local_7c;
  Vector2f local_74;
  Vector2f local_6c;
  Vector2<float> local_64;
  Vector2Type local_5c;
  Vector2Type local_54;
  float local_4c;
  NumericValue NStack_48;
  float blur_extent;
  NumericValue local_40;
  Vector2f local_38;
  Vector2f offset;
  float sigma;
  Rectanglef *scissor_region_local;
  Element *element_local;
  FilterDropShadow *this_local;
  
  offset = *(Vector2f *)&this->value_sigma;
  fVar1 = Element::ResolveLength(element,(NumericValue)offset);
  local_40 = this->value_offset_x;
  x = Element::ResolveLength(element,local_40);
  NStack_48 = this->value_offset_y;
  y = Element::ResolveLength(element,NStack_48);
  Vector2<float>::Vector2(&local_38,x,y);
  local_4c = fVar1 * 3.0;
  local_74 = Vector2<float>::operator-(&local_38);
  Vector2<float>::Vector2(&local_7c,0.0);
  local_6c = Math::Max<Rml::Vector2<float>>(local_74,local_7c);
  Vector2<float>::Vector2(&local_84,local_4c);
  local_64 = Vector2<float>::operator+(&local_6c,local_84);
  local_a0 = local_38;
  Vector2<float>::Vector2(&local_a8,0.0);
  local_94 = Math::Max<Rml::Vector2<float>>(local_a0,local_a8);
  Vector2<float>::Vector2(&local_b0,local_4c);
  local_8c = Vector2<float>::operator+(&local_94,local_b0);
  RVar2 = Rectangle<float>::Extend(scissor_region,local_64,local_8c);
  local_5c = RVar2.p0;
  scissor_region->p0 = local_5c;
  local_54 = RVar2.p1;
  scissor_region->p1 = local_54;
  return;
}

Assistant:

void FilterDropShadow::ExtendInkOverflow(Element* element, Rectanglef& scissor_region) const
{
	// Expand the ink overflow area to cover both the native element *and* its offset shadow w/blur.
	const float sigma = element->ResolveLength(value_sigma);
	const Vector2f offset = {
		element->ResolveLength(value_offset_x),
		element->ResolveLength(value_offset_y),
	};

	const float blur_extent = 3.f * sigma;
	scissor_region =
		scissor_region.Extend(Math::Max(-offset, Vector2f(0.f)) + Vector2f(blur_extent), Math::Max(offset, Vector2f(0.f)) + Vector2f(blur_extent));
}